

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastErP2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint *puVar1;
  char *pcVar2;
  
  if (data.field_0._0_2_ == 0) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar1 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar1 = *puVar1 | (uint)hasbits;
    }
    RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
    pcVar2 = EpsCopyInputStream::
             ReadPackedVarint<google::protobuf::internal::TcParser::PackedEnum<unsigned_short,(unsigned_short)1536>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::TcParser::PackedEnum<unsigned_short,(unsigned_short)1536>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_>(char_const*,google::protobuf::internal::TcParser::PackedEnum<unsigned_short,(unsigned_short)1536>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_)::_lambda(int)_1_>
                       (&ctx->super_EpsCopyInputStream,ptr + 2);
    return pcVar2;
  }
  pcVar2 = MiniParse(msg,ptr,ctx,data,table,hasbits);
  return pcVar2;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErP2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedEnum<uint16_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}